

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

size_type __thiscall wabt::string_view::find(string_view *this,char *s,size_type pos)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  
  sVar2 = strlen(s);
  uVar1 = this->size_;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  pcVar3 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (this->data_ + pos,this->data_ + uVar1,s,s + sVar2);
  sVar4 = 0xffffffffffffffff;
  if (pcVar3 != this->data_ + this->size_) {
    sVar4 = (long)pcVar3 - (long)this->data_;
  }
  return sVar4;
}

Assistant:

string_view::size_type string_view::find(const char* s, size_type pos) const {
  return find(string_view(s), pos);
}